

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmt_bin_decode_nvidia.c
# Opt level: O1

uint load_memory_dump(uint pfx,mmt_memory_dump_prefix **dump,mmt_buf **buf,
                     mmt_nvidia_decode_funcs *funcs)

{
  byte bVar1;
  uint32_t uVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  void *pvVar7;
  mmt_memory_dump_prefix *pmVar8;
  mmt_buf *pmVar9;
  int iVar10;
  uint uVar11;
  void *unaff_R13;
  
  *dump = (mmt_memory_dump_prefix *)0x0;
  iVar5 = 0;
  *buf = (mmt_buf *)0x0;
  do {
    pcVar6 = (char *)mmt_load_data_with_prefix(1,pfx,1);
    if ((pcVar6 == (char *)0x0) || (*pcVar6 != 'n')) goto switchD_001030c5_caseD_5;
    bVar3 = false;
    mmt_load_data_with_prefix(2,pfx,0);
    unaff_R13 = mmt_load_data_with_prefix(2,pfx,0);
    if (unaff_R13 == (void *)0x0) {
      unaff_R13 = (void *)0x0;
      goto switchD_001030c5_caseD_e;
    }
    bVar1 = *(byte *)((long)unaff_R13 + 1);
    bVar3 = true;
    iVar10 = bVar1 - 0x61;
    switch(iVar10) {
    case 0:
switchD_001030c5_caseD_0:
      if (funcs->alloc_map != (_func_void_mmt_nvidia_alloc_map_ptr_void_ptr *)0x0) {
        if (bVar1 < 0x72) {
          switch(bVar1) {
          case 0x62:
            goto switchD_001030c5_caseD_1;
          case 99:
          case 100:
          case 0x66:
          case 0x69:
          case 0x6a:
          case 0x6b:
          case 0x6c:
            goto switchD_001030c5_caseD_5;
          case 0x65:
            goto switchD_001030c5_caseD_4;
          case 0x67:
            goto switchD_001030c5_caseD_6;
          case 0x68:
            goto switchD_001030c5_caseD_7;
          case 0x6d:
            goto switchD_001030c5_caseD_c;
          default:
            goto switchD_001030c5_default;
          }
        }
LAB_001032a1:
        if (bVar1 == 0x72) goto switchD_001030c5_caseD_11;
        goto LAB_00103388;
      }
      goto LAB_0010336e;
    case 1:
switchD_001030c5_caseD_1:
      if (funcs->bind != (_func_void_mmt_nvidia_bind_ptr_void_ptr *)0x0) {
        if (bVar1 != 0x78) {
          if (bVar1 != 0x76) goto LAB_00103353;
          goto switchD_001030c5_caseD_15;
        }
        goto switchD_001030c5_caseD_17;
      }
LAB_001033bf:
      uVar4 = 0xb;
      mmt_load_data_with_prefix(0xb,pfx,0);
      uVar11 = pfx + 0xb;
      goto LAB_001033d7;
    case 2:
      if (funcs->create_object != (_func_void_mmt_nvidia_create_object_ptr_void_ptr *)0x0) {
        switch(iVar10) {
        case 0:
          goto switchD_001030c5_caseD_0;
        case 1:
          goto switchD_001030c5_caseD_1;
        case 2:
        case 5:
        case 8:
        case 9:
        case 10:
        case 0xd:
        case 0xe:
        case 0x10:
        case 0x12:
        case 0x14:
        case 0x16:
          goto switchD_001030c5_caseD_5;
        case 3:
          goto switchD_001030c5_caseD_3;
        case 4:
          goto switchD_001030c5_caseD_4;
        case 6:
          goto switchD_001030c5_caseD_6;
        case 7:
          goto switchD_001030c5_caseD_7;
        case 0xb:
          goto switchD_001030c5_caseD_b;
        case 0xc:
          goto switchD_001030c5_caseD_c;
        case 0xf:
          goto switchD_001030c5_caseD_f;
        case 0x11:
          goto switchD_001030c5_caseD_11;
        case 0x13:
          goto switchD_001030c5_caseD_13;
        case 0x15:
          goto switchD_001030c5_caseD_15;
        case 0x17:
          goto switchD_001030c5_caseD_17;
        default:
          goto switchD_001030c5_default;
        }
      }
      uVar4 = load_create_object((mmt_nvidia_create_object **)0x0,pfx);
      goto LAB_001033f9;
    case 3:
switchD_001030c5_caseD_3:
      if (funcs->destroy_object != (_func_void_mmt_nvidia_destroy_object_ptr_void_ptr *)0x0) {
        switch(iVar10) {
        case 0:
          goto switchD_001030c5_caseD_0;
        case 1:
          goto switchD_001030c5_caseD_1;
        case 2:
        case 3:
        case 5:
        case 8:
        case 9:
        case 10:
        case 0xd:
        case 0xe:
        case 0x10:
        case 0x12:
        case 0x14:
        case 0x16:
          goto switchD_001030c5_caseD_5;
        case 4:
          goto switchD_001030c5_caseD_4;
        case 6:
          goto switchD_001030c5_caseD_6;
        case 7:
          goto switchD_001030c5_caseD_7;
        case 0xb:
          goto switchD_001030c5_caseD_b;
        case 0xc:
          goto switchD_001030c5_caseD_c;
        case 0xf:
          goto switchD_001030c5_caseD_f;
        case 0x11:
          goto switchD_001030c5_caseD_11;
        case 0x13:
          goto switchD_001030c5_caseD_13;
        case 0x15:
          goto switchD_001030c5_caseD_15;
        case 0x17:
          goto switchD_001030c5_caseD_17;
        default:
          goto switchD_001030c5_default;
        }
      }
      goto LAB_001033bf;
    case 4:
switchD_001030c5_caseD_4:
      if (funcs->unmap != (_func_void_mmt_nvidia_unmap_ptr_void_ptr *)0x0) {
        if (bVar1 < 0x76) {
          if (bVar1 != 0x62) goto LAB_00103353;
          goto switchD_001030c5_caseD_1;
        }
LAB_00103388:
        if (bVar1 == 0x76) goto switchD_001030c5_caseD_15;
        goto LAB_00103397;
      }
      goto LAB_0010336e;
    case 5:
    case 8:
    case 9:
    case 10:
    case 0xd:
    case 0x10:
    case 0x12:
    case 0x14:
    case 0x16:
      break;
    case 6:
switchD_001030c5_caseD_6:
      if (funcs->gpu_map != (_func_void_mmt_nvidia_gpu_map_ptr_void_ptr *)0x0) {
        if (bVar1 < 0x68) {
          if (bVar1 < 0x62) goto switchD_001030c5_default;
LAB_00103321:
          if (bVar1 == 0x62) goto switchD_001030c5_caseD_1;
          if (bVar1 == 0x65) goto switchD_001030c5_caseD_4;
        }
        else {
          if (0x71 < bVar1) goto LAB_001032a1;
          if (bVar1 == 0x68) goto switchD_001030c5_caseD_7;
LAB_0010324f:
          if (bVar1 == 0x6d) goto switchD_001030c5_caseD_c;
        }
        break;
      }
LAB_0010325d:
      uVar4 = 0x17;
      mmt_load_data_with_prefix(0x17,pfx,0);
      uVar11 = pfx + 0x17;
      goto LAB_001033d7;
    case 7:
switchD_001030c5_caseD_7:
      if (funcs->gpu_unmap != (_func_void_mmt_nvidia_gpu_unmap_ptr_void_ptr *)0x0) {
        if (bVar1 < 0x6d) {
          if (bVar1 != 0x48) goto LAB_00103321;
LAB_0010322e:
          if (funcs->gpu_unmap2 == (_func_void_mmt_nvidia_gpu_unmap2_ptr_void_ptr *)0x0)
          goto LAB_0010325d;
          if (0x71 < bVar1) goto LAB_001032a1;
          if (bVar1 != 0x62) {
            if (bVar1 != 0x65) goto LAB_0010324f;
            goto switchD_001030c5_caseD_4;
          }
          goto switchD_001030c5_caseD_1;
        }
        if (0x75 < bVar1) goto LAB_00103388;
        if (bVar1 == 0x6d) goto switchD_001030c5_caseD_c;
LAB_00103353:
        if (bVar1 == 0x72) goto switchD_001030c5_caseD_11;
        break;
      }
      goto LAB_0010336e;
    case 0xb:
switchD_001030c5_caseD_b:
      if (funcs->call_method != (_func_void_mmt_nvidia_call_method_ptr_void_ptr *)0x0) {
        switch(iVar10) {
        case 0:
          goto switchD_001030c5_caseD_0;
        case 1:
          goto switchD_001030c5_caseD_1;
        case 2:
        case 3:
        case 5:
        case 8:
        case 9:
        case 10:
        case 0xb:
        case 0xd:
        case 0xe:
        case 0x10:
        case 0x12:
        case 0x14:
        case 0x16:
          goto switchD_001030c5_caseD_5;
        case 4:
          goto switchD_001030c5_caseD_4;
        case 6:
          goto switchD_001030c5_caseD_6;
        case 7:
          goto switchD_001030c5_caseD_7;
        case 0xc:
          goto switchD_001030c5_caseD_c;
        case 0xf:
          goto switchD_001030c5_caseD_f;
        case 0x11:
          goto switchD_001030c5_caseD_11;
        case 0x13:
          goto switchD_001030c5_caseD_13;
        case 0x15:
          goto switchD_001030c5_caseD_15;
        case 0x17:
          goto switchD_001030c5_caseD_17;
        default:
          goto switchD_001030c5_default;
        }
      }
      goto LAB_001033bf;
    case 0xc:
switchD_001030c5_caseD_c:
      uVar4 = 0x2f;
      mmt_load_data_with_prefix(0x2f,pfx,0);
      uVar11 = pfx + 0x2f;
      goto LAB_001033d7;
    case 0xe:
      goto switchD_001030c5_caseD_e;
    case 0xf:
switchD_001030c5_caseD_f:
      if (funcs->create_mapped != (_func_void_mmt_nvidia_create_mapped_object_ptr_void_ptr *)0x0) {
        switch(iVar10) {
        case 0:
          goto switchD_001030c5_caseD_0;
        case 1:
          goto switchD_001030c5_caseD_1;
        case 2:
        case 3:
        case 5:
        case 8:
        case 9:
        case 10:
        case 0xb:
        case 0xd:
        case 0xe:
        case 0xf:
        case 0x10:
        case 0x12:
        case 0x14:
        case 0x16:
          goto switchD_001030c5_caseD_5;
        case 4:
          goto switchD_001030c5_caseD_4;
        case 6:
          goto switchD_001030c5_caseD_6;
        case 7:
          goto switchD_001030c5_caseD_7;
        case 0xc:
          goto switchD_001030c5_caseD_c;
        case 0x11:
          goto switchD_001030c5_caseD_11;
        case 0x13:
          goto switchD_001030c5_caseD_13;
        case 0x15:
          goto switchD_001030c5_caseD_15;
        case 0x17:
          goto switchD_001030c5_caseD_17;
        default:
          goto switchD_001030c5_default;
        }
      }
      goto LAB_0010325d;
    case 0x11:
switchD_001030c5_caseD_11:
      if (funcs->create_driver_object !=
          (_func_void_mmt_nvidia_create_driver_object_ptr_void_ptr *)0x0) {
        if (bVar1 == 0x78) goto switchD_001030c5_caseD_17;
        if (bVar1 == 0x76) goto switchD_001030c5_caseD_15;
        break;
      }
LAB_0010336e:
      uVar4 = 0x13;
      mmt_load_data_with_prefix(0x13,pfx,0);
      uVar11 = pfx + 0x13;
      goto LAB_001033d7;
    case 0x13:
switchD_001030c5_caseD_13:
      if (funcs->create_dma_object != (_func_void_mmt_nvidia_create_dma_object_ptr_void_ptr *)0x0) {
        if (bVar1 < 0x72) {
          switch(iVar10) {
          case 0:
            goto switchD_001030c5_caseD_0;
          case 1:
            goto switchD_001030c5_caseD_1;
          case 2:
          case 3:
          case 5:
          case 8:
          case 9:
          case 10:
          case 0xb:
            goto switchD_001030c5_caseD_5;
          case 4:
            goto switchD_001030c5_caseD_4;
          case 6:
            goto switchD_001030c5_caseD_6;
          case 7:
            goto switchD_001030c5_caseD_7;
          case 0xc:
            goto switchD_001030c5_caseD_c;
          default:
            goto switchD_001030c5_default;
          }
        }
        goto LAB_001032a1;
      }
      uVar4 = 0xf;
      mmt_load_data_with_prefix(0xf,pfx,0);
      uVar11 = pfx + 0xf;
LAB_001033d7:
      mmt_check_eor(uVar11);
LAB_001033f9:
      iVar5 = iVar5 + uVar4;
      pfx = pfx + uVar4;
      goto switchD_001030c5_caseD_e;
    case 0x15:
switchD_001030c5_caseD_15:
      if (funcs->create_device_object ==
          (_func_void_mmt_nvidia_create_device_object_ptr_void_ptr *)0x0) {
        load_create_device_object((mmt_nvidia_create_device_object **)0x0,pfx);
        goto LAB_001033f4;
      }
LAB_00103397:
      if (bVar1 == 0x78) goto switchD_001030c5_caseD_17;
      break;
    case 0x17:
switchD_001030c5_caseD_17:
      if (funcs->create_context_object !=
          (_func_void_mmt_nvidia_create_context_object_ptr_void_ptr *)0x0) break;
      load_create_context_object((mmt_nvidia_create_context_object **)0x0,pfx);
LAB_001033f4:
      uVar4 = 7;
      goto LAB_001033f9;
    default:
switchD_001030c5_default:
      if (bVar1 == 0x47) {
        if (funcs->gpu_map2 == (_func_void_mmt_nvidia_gpu_map2_ptr_void_ptr *)0x0) {
          uVar4 = 0x1b;
          mmt_load_data_with_prefix(0x1b,pfx,0);
          uVar11 = pfx + 0x1b;
          goto LAB_001033d7;
        }
      }
      else if (bVar1 == 0x48) goto LAB_0010322e;
    }
switchD_001030c5_caseD_5:
    bVar3 = false;
switchD_001030c5_caseD_e:
    if (!bVar3) {
      return 0;
    }
    if (*(char *)((long)unaff_R13 + 1) == 'o') {
      pvVar7 = mmt_load_data_with_prefix(0xe,pfx,0);
      mmt_buf_check_sanity((mmt_buf *)((long)pvVar7 + 10));
      iVar10 = *(int *)((long)pvVar7 + 10);
      pmVar8 = (mmt_memory_dump_prefix *)mmt_load_data_with_prefix(iVar10 + 0xe,pfx,0);
      uVar11 = pfx + iVar10 + 0xe;
      pmVar9 = (mmt_buf *)mmt_load_data_with_prefix(4,uVar11,0);
      mmt_buf_check_sanity(pmVar9);
      uVar2 = pmVar9->len;
      pmVar9 = (mmt_buf *)mmt_load_data_with_prefix(uVar2 + 5,uVar11,0);
      iVar10 = uVar2 + iVar10 + 0x13;
      mmt_check_eor(pfx + iVar10);
      *dump = pmVar8;
      *buf = pmVar9;
      return iVar5 + iVar10;
    }
  } while( true );
}

Assistant:

static unsigned int load_memory_dump(unsigned int pfx, struct mmt_memory_dump_prefix **dump,
		struct mmt_buf **buf, struct mmt_nvidia_decode_funcs *funcs)
{
	unsigned int size1, size2, omitted = 0;
	struct mmt_memory_dump_prefix *d;
	struct mmt_buf *b;
	*dump = NULL;
	*buf = NULL;
	struct mmt_message_nv *nv;

	do
	{
		struct mmt_message *msg = mmt_load_data_with_prefix(1, pfx, 1);
		if (msg == NULL || msg->type != 'n')
			return 0;

		mmt_load_data_with_prefix(sizeof(struct mmt_message_nv), pfx, 0);

		nv = mmt_load_data_with_prefix(sizeof(struct mmt_message_nv), pfx, 0);
		if (nv == NULL)
			return 0;

		if (nv->subtype != 'o')
		{
			unsigned int omit;
			if (nv->subtype == 'c' && funcs->create_object == NULL)
				omit = load_create_object(NULL, pfx);
			else if (nv->subtype == 'd' && funcs->destroy_object == NULL)
				omit = load_destroy_object(NULL, pfx);
			else if (nv->subtype == 'l' && funcs->call_method == NULL)
				omit = load_call_method(NULL, pfx);
			else if (nv->subtype == 'p' && funcs->create_mapped == NULL)
				omit = load_create_mapped_object(NULL, pfx);
			else if (nv->subtype == 't' && funcs->create_dma_object == NULL)
				omit = load_create_dma_object(NULL, pfx);
			else if (nv->subtype == 'a' && funcs->alloc_map == NULL)
				omit = load_alloc_map(NULL, pfx);
			else if (nv->subtype == 'g' && funcs->gpu_map == NULL)
				omit = load_gpu_map(NULL, pfx);
			else if (nv->subtype == 'G' && funcs->gpu_map2 == NULL)
				omit = load_gpu_map2(NULL, pfx);
			else if (nv->subtype == 'h' && funcs->gpu_unmap == NULL)
				omit = load_gpu_unmap(NULL, pfx);
			else if (nv->subtype == 'H' && funcs->gpu_unmap2 == NULL)
				omit = load_gpu_unmap2(NULL, pfx);
			else if (nv->subtype == 'm' /*&& funcs->mmap == NULL*/)
				omit = load_mmap(NULL, pfx);
			else if (nv->subtype == 'e' && funcs->unmap == NULL)
				omit = load_unmap(NULL, pfx);
			else if (nv->subtype == 'b' && funcs->bind == NULL)
				omit = load_bind(NULL, pfx);
			else if (nv->subtype == 'r' && funcs->create_driver_object == NULL)
				omit = load_create_driver_object(NULL, pfx);
			else if (nv->subtype == 'v' && funcs->create_device_object == NULL)
				omit = load_create_device_object(NULL, pfx);
			else if (nv->subtype == 'x' && funcs->create_context_object == NULL)
				omit = load_create_context_object(NULL, pfx);
			else
			{
				//if (nv->subtype != 'j' && nv->subtype != 'i')
				//	printf("%d '%c'\n", nv->subtype, nv->subtype);
				return 0;
			}

			omitted += omit;
			pfx += omit;
		}
	}
	while (nv->subtype != 'o');

	size1 = sizeof(struct mmt_memory_dump_prefix);
	d = mmt_load_data_with_prefix(size1, pfx, 0);
	mmt_buf_check_sanity(&d->str);
	size1 += d->str.len;
	d = mmt_load_data_with_prefix(size1, pfx, 0);

	size2 = 4;
	b = mmt_load_data_with_prefix(size2, size1 + pfx, 0);
	mmt_buf_check_sanity(b);
	size2 += b->len + 1;
	b = mmt_load_data_with_prefix(size2, size1 + pfx, 0);

	mmt_check_eor(size2 + size1 + pfx);

	*dump = d;
	*buf = b;

	return size1 + size2 + omitted;
}